

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O3

void __thiscall Solution::validate(Solution *this)

{
  size_t sVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Solution *pSVar3;
  mapped_type *pmVar4;
  int iVar5;
  long *plVar6;
  long *plVar7;
  Solution *local_38;
  
  pSVar3 = (Solution *)
           (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (pSVar3 != this) {
    do {
      sVar1 = (pSVar3->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
              _M_node._M_size;
      plVar7 = *(long **)(sVar1 + 8);
      plVar6 = (long *)(sVar1 + 8);
      if (plVar7 != plVar6) {
        iVar5 = 0;
        do {
          plVar2 = (long *)plVar7[2];
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[3];
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          local_38 = this;
          pmVar4 = std::__detail::
                   _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(*plVar2 + 0x20),&local_38);
          if (iVar5 != pmVar4->second) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"invalid state",0xd);
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          plVar7 = (long *)*plVar7;
          iVar5 = iVar5 + 1;
        } while (plVar7 != plVar6);
      }
      pSVar3 = (Solution *)
               (pSVar3->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
    } while (pSVar3 != this);
  }
  return;
}

Assistant:

void Solution::validate() {
    for (auto vehicle: vehicles) {
        auto i = 0;
        for (auto it = vehicle->nodes.begin(); it != vehicle->nodes.end(); ++it) {
            auto vs = *it;
            auto pos = vs->p->state[this].second;
            if (i != pos) {
                std::cout << "invalid state";
            }
            i++;
        }
    }
}